

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O3

int __thiscall Node::OutputOngo(Node *this,ostream *os,char *OnType,int GoLevel)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  ostream *poVar3;
  size_t sVar4;
  long *plVar5;
  string local_50;
  
  for (; this->Type == 0x1f5; this = this->Tree[1]) {
    OutputOngo(this->Tree[0],os,OnType,GoLevel);
    GoLevel = GoLevel + 1;
  }
  if (this->Type == 0x1d2) {
    iVar2 = 0;
    if (0 < Level) {
      iVar2 = Level;
    }
    paVar1 = &local_50.field_2;
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_50,(char)iVar2);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"case ",5);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,GoLevel);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    Level = Level + 1;
    iVar2 = 0;
    if (0 < Level) {
      iVar2 = Level;
    }
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_50,(char)iVar2);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,local_50._M_dataplus._M_p,local_50._M_string_length);
    if (OnType == (char *)0x0) {
      std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
    }
    else {
      sVar4 = strlen(OnType);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,OnType,sVar4);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    iVar2 = strcmp(OnType,"goto");
    if (iVar2 == 0) {
      local_50._M_dataplus._M_p._0_1_ = 0x20;
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_50,1);
      OutputLabel_abi_cxx11_(&local_50,this);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,local_50._M_dataplus._M_p,local_50._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,";",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
    }
    else {
      local_50._M_dataplus._M_p._0_1_ = 0x28;
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)&local_50,1);
      OutputLabel_abi_cxx11_(&local_50,this);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,local_50._M_dataplus._M_p,local_50._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,");",2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar1) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      iVar2 = 0;
      if (0 < Level) {
        iVar2 = Level;
      }
      local_50._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct((ulong)&local_50,(char)iVar2);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,local_50._M_dataplus._M_p,local_50._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"break;",6);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    Level = Level + -1;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(os,"Error in computed ",0x12);
    if (OnType == (char *)0x0) {
      std::ios::clear((int)os + (int)*(undefined8 *)(*(long *)os + -0x18));
    }
    else {
      sVar4 = strlen(OnType);
      std::__ostream_insert<char,std::char_traits<char>>(os,OnType,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os," (",2);
    Expression_abi_cxx11_(&local_50,this);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,local_50._M_dataplus._M_p,local_50._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,") @ ",4);
    plVar5 = (long *)std::ostream::operator<<((ostream *)poVar3,this->lineno);
    std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
    std::ostream::put((char)plVar5);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return 0;
}

Assistant:

int Node::OutputOngo(
	std::ostream& os,	/**< iostream to write C++ code to */
	const char* OnType,	/**< data type */
	int GoLevel		/**< goto level */
)
{
	int flag = 0;

	switch(Type)
	{
	case BAS_N_LIST:
		flag = Tree[0]->OutputOngo(os, OnType, GoLevel);
		flag += Tree[1]->OutputOngo(os, OnType, GoLevel + 1);
		break;

	case BAS_V_USELABEL:
		os << Indent() << "case " << GoLevel << ":" << std::endl;
		Level++;
		os << Indent() << OnType;
		if (strcmp(OnType, "goto") == 0)
		{
			os << ' ' << OutputLabel() << ";" << std::endl;
			// goto doesn't need to be followed by a break
		}
		else
		{
			os << '(' << OutputLabel() << ");" << std::endl;
			os << Indent() << "break;" << std::endl;
		}
		Level--;
		break;

	default:
		os << "Error in computed " << OnType <<
			" (" << Expression() << ") @ " << lineno << std::endl;
		break;
	}
	return flag;
}